

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O3

int coda_cursor_get_bit_size(coda_cursor *cursor,int64_t *bit_size)

{
  coda_native_type cVar1;
  uint uVar2;
  coda_backend cVar3;
  int *piVar4;
  coda_dynamic_type_struct *pcVar5;
  int iVar6;
  int iVar7;
  coda_type_class cVar8;
  coda_product_struct *pcVar9;
  undefined4 uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  size_t __n;
  anon_struct_24_3_5e6533e2 *paVar14;
  char *message;
  coda_product *product;
  coda_type *pcVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int64_t length;
  ulong *puVar19;
  uint8_t uStack_3b9;
  long lStack_3b8;
  ulong uStack_3b0;
  anon_struct_24_3_5e6533e2 *paStack_3a8;
  ulong uStack_3a0;
  ulong uStack_398;
  long lStack_390;
  char acStack_388 [64];
  coda_cursor cStack_348;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (pcVar5 = cursor->stack[cursor->n - 1].type, pcVar5 == (coda_dynamic_type_struct *)0x0)) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x659);
    return -1;
  }
  cVar3 = pcVar5->backend;
  if (100 < (int)cVar3) {
    if (cVar3 - coda_backend_hdf4 < 5) {
      *bit_size = -1;
    }
    return 0;
  }
  if (cVar3 != coda_backend_ascii) {
    if (cVar3 != coda_backend_binary) {
      if (cVar3 == coda_backend_memory) {
        iVar6 = coda_mem_cursor_get_bit_size(cursor,bit_size);
        return iVar6;
      }
      return 0;
    }
    pcVar15 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
    if (99 < pcVar15->format) {
      pcVar15 = *(coda_type **)&pcVar15->type_class;
    }
    if (pcVar15->bit_size < 0) {
      uVar2 = pcVar15->type_class;
      if (uVar2 - 2 < 4) {
        if (pcVar15->size_expr != (coda_expression *)0x0) {
          cStack_348.stack[0].index = 0x11d458;
          iVar6 = coda_expression_eval_integer(pcVar15->size_expr,cursor,bit_size);
          if (iVar6 == 0) {
            lVar13 = *bit_size;
            if (pcVar15->bit_size == -8) {
              lVar13 = lVar13 << 3;
              *bit_size = lVar13;
            }
            if (-1 < lVar13) {
              return 0;
            }
            cStack_348.stack[0].index = 0x11d4f7;
            coda_set_error(-300,"calculated size is negative (%ld bits)");
          }
          else {
            cStack_348.stack[0].index = 0x11d46a;
            coda_add_error_message(" for size expression");
          }
          cStack_348.stack[0].index = 0x11d472;
          coda_cursor_add_to_error_message(cursor);
          return -1;
        }
        *bit_size = -1;
      }
      else {
        if (uVar2 < 2) {
          iVar6 = coda_ascbin_cursor_get_bit_size(cursor,bit_size);
          return iVar6;
        }
        if (uVar2 == 6) {
          cStack_348.stack[0].index = 0x11d4a8;
          memcpy(&cStack_348.stack[0].bit_offset,cursor,0x310);
          cStack_348.stack[0].index = 0x11d4b0;
          iVar6 = coda_ascbin_cursor_use_base_type_of_special_type
                            ((coda_cursor *)&cStack_348.stack[0].bit_offset);
          if (iVar6 != 0) {
            return -1;
          }
          cStack_348.stack[0].index = 0x11d507;
          iVar6 = coda_cursor_get_bit_size((coda_cursor *)&cStack_348.stack[0].bit_offset,bit_size);
          if (iVar6 != 0) {
            return -1;
          }
        }
      }
    }
    else {
      *bit_size = pcVar15->bit_size;
    }
    return 0;
  }
  pcVar15 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar15->format) {
    pcVar15 = *(coda_type **)&pcVar15->type_class;
  }
  if (-1 < pcVar15->bit_size) {
    *bit_size = pcVar15->bit_size;
    return 0;
  }
  if (pcVar15->type_class < 2) {
    iVar6 = coda_ascbin_cursor_get_bit_size(cursor,bit_size);
    return iVar6;
  }
  paVar14 = cursor->stack;
  lVar13 = cursor->stack[(long)cursor->n + -1].bit_offset;
  length = -1;
  iVar6 = get_bit_size_boundary(cursor,(int64_t *)&uStack_3b0,-1);
  if (iVar6 == 0) {
    iVar6 = pcVar15->type_class;
    if (iVar6 - 2U < 2) {
      puVar19 = (ulong *)pcVar15[1].description;
      if (puVar19 == (ulong *)0x0) {
        length = -1;
        if (pcVar15->size_expr != (coda_expression *)0x0) goto LAB_0011ab04;
        puVar19 = (ulong *)0x0;
      }
LAB_0011a9e6:
      uStack_3a0 = uStack_3b0;
      length = 0x40;
      if ((long)uStack_3b0 >> 3 < 0x40) {
        length = (long)uStack_3b0 >> 3;
      }
      paStack_3a8 = paVar14;
      iVar6 = read_bytes_in_bounds(cursor->product,lVar13 >> 3,length,acStack_388);
      if (iVar6 == 0) {
        paVar14 = paStack_3a8;
        lStack_3b8 = length;
        if (puVar19 != (ulong *)0x0) {
          lVar13 = (long)(int)puVar19[1];
          if (0 < lVar13) {
            uVar12 = puVar19[2];
            lVar17 = 0;
            uVar11 = uStack_3a0;
            uStack_398 = uVar12;
            lStack_390 = lVar13;
            do {
              piVar4 = *(int **)(uVar12 + lVar17 * 8);
              iVar6 = *piVar4;
              __n = (size_t)iVar6;
              if (__n == 0) {
                if (uVar11 < 8) {
                  uStack_3b0 = 0;
                  goto LAB_0011ad07;
                }
              }
              else if (((long)__n <= lStack_3b8) &&
                      (iVar7 = bcmp(*(void **)(piVar4 + 2),acStack_388,__n), uVar11 = uStack_3a0,
                      lVar13 = lStack_390, uVar12 = uStack_398, iVar7 == 0)) {
                uStack_3b0 = (ulong)(iVar6 << 3);
                goto LAB_0011ad07;
              }
              lVar17 = lVar17 + 1;
            } while (lVar13 != lVar17);
          }
          uStack_3b0 = *puVar19;
          paVar14 = paStack_3a8;
          length = lStack_3b8;
          if (-1 < (long)uStack_3b0) goto LAB_0011ad07;
        }
        goto LAB_0011ab04;
      }
      goto LAB_0011a97b;
    }
    if (iVar6 == 4) {
      length = -1;
      if (pcVar15->size_expr == (coda_expression *)0x0) {
        puVar19 = (ulong *)0x0;
        if (pcVar15[1].type_class == coda_record_class) {
          *bit_size = uStack_3b0;
          return 0;
        }
        goto LAB_0011a9e6;
      }
LAB_0011ab04:
      iVar6 = pcVar15->type_class;
    }
    else if (iVar6 == 6) {
      if (pcVar15[1].format != 2) goto LAB_0011ab0e;
      if (*(int *)(*(long *)&pcVar15[1].type_class + 8) != 4) {
        __assert_fail("base_type->type_class == coda_text_class",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                      ,0x2be,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
      }
      length = -1;
      if (*(int *)(*(long *)&pcVar15[1].type_class + 0x40) == 0) goto LAB_0011ad07;
      goto LAB_0011ab04;
    }
    if (iVar6 == 6) {
LAB_0011ab0e:
      memcpy(&cStack_348,cursor,0x310);
      iVar6 = coda_cursor_use_base_type_of_special_type(&cStack_348);
      if (iVar6 == 0) {
        iVar6 = coda_cursor_get_bit_size(&cStack_348,bit_size);
        return iVar6;
      }
      return -1;
    }
    if (pcVar15->size_expr != (coda_expression *)0x0) {
      iVar6 = coda_expression_eval_integer(pcVar15->size_expr,cursor,bit_size);
      if (iVar6 == 0) {
        lVar13 = *bit_size;
        if (pcVar15->bit_size == -8) {
          lVar13 = lVar13 << 3;
          *bit_size = lVar13;
        }
        if (-1 < lVar13) {
          return 0;
        }
        coda_set_error(-300,"calculated size is negative (%ld bits)");
      }
      else {
        coda_add_error_message(" for size expression");
      }
      coda_cursor_add_to_error_message(cursor);
      goto LAB_0011a97b;
    }
    if (iVar6 - 2U < 2) {
      cVar1 = pcVar15->read_type;
      if (9 < (uint)cVar1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                      ,0x329,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
      }
      if ((0x55U >> (cVar1 & 0x1f) & 1) == 0) {
        if ((0xaaU >> (cVar1 & 0x1f) & 1) == 0) {
          lVar13 = coda_ascii_parse_double(acStack_388,length,(double *)&cStack_348,1);
        }
        else {
          lVar13 = coda_ascii_parse_uint64(acStack_388,length,(uint64_t *)&cStack_348,1);
        }
      }
      else {
        lVar13 = coda_ascii_parse_int64(acStack_388,length,(int64_t *)&cStack_348,1);
      }
      if (lVar13 < 0) {
        return -1;
      }
      uStack_3b0 = lVar13 << 3;
LAB_0011ad07:
      *bit_size = uStack_3b0;
      return 0;
    }
    if (iVar6 != 4) {
      __assert_fail("type->type_class == coda_text_class",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                    ,0x335,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
    }
    cVar8 = pcVar15[1].type_class;
    iVar6 = 0;
    switch(cVar8) {
    case coda_record_class:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                    ,0x40f,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
    case coda_array_class:
      if (cursor->product->format != coda_format_ascii) {
        __assert_fail("cursor->product->format == coda_format_ascii",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                      ,0x339,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
      }
      iVar6 = (int)cursor->product[1].file_size;
      if (iVar6 - 1U < 2) {
        *bit_size = 8;
        return 0;
      }
      if (iVar6 != 0) {
        if (iVar6 == 3) {
          *bit_size = 0x10;
          return 0;
        }
        return 0;
      }
      if ((paVar14[(long)cursor->n + -1].bit_offset & 7) == 0) {
        iVar6 = coda_ascii_cursor_read_bytes(cursor,&uStack_3b9,0,1);
        if (iVar6 == 0) {
          if (uStack_3b9 == '\r') {
            pcVar9 = cursor->product;
            if (1 < pcVar9->file_size - (paVar14[(long)cursor->n + -1].bit_offset >> 3)) {
              iVar6 = coda_ascii_cursor_read_bytes(cursor,&uStack_3b9,1,1);
              if (iVar6 != 0) goto LAB_0011a97b;
              pcVar9 = cursor->product;
              if (uStack_3b9 == '\n') {
                *bit_size = 0x10;
                uVar10 = 3;
                goto LAB_0011b020;
              }
            }
            *bit_size = 8;
            uVar10 = 2;
LAB_0011b020:
            *(undefined4 *)&pcVar9[1].file_size = uVar10;
            return 0;
          }
          if (uStack_3b9 == '\n') {
            *bit_size = 8;
            pcVar9 = cursor->product;
            uVar10 = 1;
            goto LAB_0011b020;
          }
          coda_str64(paVar14[(long)cursor->n + -1].bit_offset >> 3,(char *)&cStack_348);
          coda_set_error(-300,
                         "product error detected (invalid end-of-line sequence - not a carriage return or linefeed character - byte offset = %s)"
                         ,&cStack_348);
        }
        goto LAB_0011a97b;
      }
      message = "product error detected (ascii line separator does not start at byte boundary)";
      break;
    case coda_integer_class:
    case coda_real_class:
      product = cursor->product;
      if (product->format != coda_format_ascii) {
        uVar12 = (long)cursor->n * 3;
        if ((paVar14[(long)cursor->n + -1].bit_offset & 7U) == 0) {
          lVar17 = paVar14[(long)cursor->n + -1].bit_offset >> 3;
          lVar16 = 0;
          lVar18 = product->file_size - lVar17;
          lVar13 = lVar16;
          if (lVar18 != 0 && lVar17 <= product->file_size) {
            do {
              iVar6 = read_bytes_in_bounds(cursor->product,lVar17 + lVar16,1,&cStack_348);
              if (iVar6 != 0) goto LAB_0011a97b;
              lVar13 = lVar16;
            } while ((((char)cStack_348.product != '\n') && ((char)cStack_348.product != '\r')) &&
                    (lVar16 = lVar16 + 1, lVar13 = lVar18, lVar18 != lVar16));
            cVar8 = pcVar15[1].type_class;
            uVar12 = (ulong)((char)cStack_348.product == '\r');
          }
          if (cVar8 != coda_integer_class) goto LAB_0011af0c;
          if (((uVar12 & 1) != 0) && (lVar13 + 1 < lVar18)) {
            iVar6 = read_bytes_in_bounds(cursor->product,lVar13 + 1 + lVar17,1,&cStack_348);
            if (iVar6 != 0) goto LAB_0011a97b;
            if ((char)cStack_348.product == '\n') {
              lVar13 = lVar13 + 1;
            }
          }
          lVar13 = lVar13 + 1;
LAB_0011af0c:
          *bit_size = lVar13 << 3;
          return 0;
        }
LAB_0011ad73:
        message = "product error detected (ascii line does not start at byte boundary)";
        break;
      }
      if ((paVar14[(long)cursor->n + -1].bit_offset & 7) != 0) goto LAB_0011ad73;
      if (product[1].root_type == (coda_dynamic_type *)0x0) {
        iVar6 = coda_ascii_init_asciilines(product);
        if (iVar6 != 0) goto LAB_0011a97b;
        product = cursor->product;
      }
      if (*(long *)&product[1].format != 0) {
        lVar17 = paVar14[(long)cursor->n + -1].bit_offset >> 3;
        lVar16 = 0;
        lVar13 = *(long *)&product[1].format + -1;
        if (lVar13 != 0) {
          do {
            lVar18 = (lVar13 + lVar16) / 2;
            if (*(long *)(&(product[1].root_type)->backend + lVar18 * 2) <= lVar17) {
              lVar16 = lVar18 + 1;
              lVar18 = lVar13;
            }
            lVar13 = lVar18;
          } while (lVar18 != lVar16);
        }
        lVar13 = (*(long *)(&(product[1].root_type)->backend + lVar16 * 2) - lVar17) * 8;
        *bit_size = lVar13;
        if (pcVar15[1].type_class == coda_real_class) {
          if ((lVar16 == *(long *)&product[1].format + -1) &&
             (*(int *)&product[1].product_definition == 0)) {
            return 0;
          }
          *bit_size = lVar13 + -8;
          if ((int)product[1].file_size == 3) {
            *bit_size = lVar13 + -0x10;
            return 0;
          }
          return 0;
        }
        return 0;
      }
      message = "trying to read from an empty file";
      iVar6 = -0x12d;
      goto LAB_0011ad7f;
    case coda_text_class:
      if ((paVar14[(long)cursor->n + -1].bit_offset & 7U) == 0) {
        lVar18 = paVar14[(long)cursor->n + -1].bit_offset >> 3;
        lVar13 = cursor->product->file_size;
        lVar17 = 0;
        lVar16 = lVar13 - lVar18;
        if (lVar16 != 0 && lVar18 <= lVar13) {
          do {
            iVar6 = read_bytes_in_bounds(cursor->product,lVar18 + lVar17,1,&cStack_348);
            if (iVar6 != 0) goto LAB_0011a97b;
          } while ((((char)cStack_348.product == ' ') ||
                   (lVar13 = lVar17, (char)cStack_348.product == '\t')) &&
                  (lVar17 = lVar17 + 1, lVar13 = lVar16, lVar16 != lVar17));
          lVar17 = lVar13 << 3;
        }
        *bit_size = lVar17;
        return 0;
      }
      message = "product error detected (ascii white space does not start at byte boundary)";
      break;
    default:
      goto switchD_0011ac38_default;
    }
    iVar6 = -300;
LAB_0011ad7f:
    coda_set_error(iVar6,message);
  }
LAB_0011a97b:
  iVar6 = -1;
switchD_0011ac38_default:
  return iVar6;
}

Assistant:

LIBCODA_API int coda_cursor_get_bit_size(const coda_cursor *cursor, int64_t *bit_size)
{
    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
            return coda_ascii_cursor_get_bit_size(cursor, bit_size);
        case coda_backend_binary:
            return coda_bin_cursor_get_bit_size(cursor, bit_size);
        case coda_backend_memory:
            return coda_mem_cursor_get_bit_size(cursor, bit_size);
        case coda_backend_hdf4:
        case coda_backend_hdf5:
        case coda_backend_cdf:
        case coda_backend_netcdf:
        case coda_backend_grib:
            *bit_size = -1;
            break;
    }

    return 0;
}